

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void t_xtra_act(keypress ch,wchar_t oid)

{
  wchar_t oid_local;
  undefined4 uStack_10;
  keypress ch_local;
  
  uStack_10 = ch.code;
  if (uStack_10 == 0x74) {
    if (t_uik_lighting == LIGHTING_LOS) {
      t_uik_lighting = LIGHTING_DARK;
    }
    else if (t_uik_lighting == LIGHTING_TORCH) {
      t_uik_lighting = LIGHTING_LOS;
    }
    else if (t_uik_lighting == LIGHTING_LIT) {
      t_uik_lighting = LIGHTING_TORCH;
    }
    else {
      t_uik_lighting = LIGHTING_LIT;
    }
  }
  else if (uStack_10 == 0x54) {
    if (t_uik_lighting == LIGHTING_LOS) {
      t_uik_lighting = LIGHTING_TORCH;
    }
    else if (t_uik_lighting == LIGHTING_LIT) {
      t_uik_lighting = LIGHTING_DARK;
    }
    else if (t_uik_lighting == LIGHTING_DARK) {
      t_uik_lighting = LIGHTING_LOS;
    }
    else {
      t_uik_lighting = LIGHTING_LIT;
    }
  }
  return;
}

Assistant:

static void t_xtra_act(struct keypress ch, int oid)
{
	/* XXX must be a better way to cycle this */
	if (ch.code == 't') {
		switch (t_uik_lighting) {
				case LIGHTING_LIT:  t_uik_lighting = LIGHTING_TORCH; break;
                case LIGHTING_TORCH: t_uik_lighting = LIGHTING_LOS; break;
				case LIGHTING_LOS:  t_uik_lighting = LIGHTING_DARK; break;
				default:	t_uik_lighting = LIGHTING_LIT; break;
		}		
	} else if (ch.code == 'T') {
		switch (t_uik_lighting) {
				case LIGHTING_DARK:  t_uik_lighting = LIGHTING_LOS; break;
                case LIGHTING_LOS: t_uik_lighting = LIGHTING_TORCH; break;
				case LIGHTING_LIT:  t_uik_lighting = LIGHTING_DARK; break;
				default:	t_uik_lighting = LIGHTING_LIT; break;
		}
	}
	
}